

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall
llvm::APInt::toString
          (APInt *this,SmallVectorImpl<char> *Str,uint Radix,bool Signed,bool formatAsCLiteral)

{
  char cVar1;
  undefined1 uVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  anon_union_8_2_1313ab2f_for_U aVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  undefined1 *puVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  ulong RHS;
  uint64_t Digit;
  APInt Tmp;
  uint64_t local_88;
  APInt *local_80;
  anon_union_8_2_1313ab2f_for_U local_78;
  uint local_70;
  char local_38 [8];
  
  if ((0x24 < Radix) || (RHS = (ulong)Radix, (0x1000010504U >> (RHS & 0x3f) & 1) == 0)) {
    __assert_fail("(Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 || Radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7e2,
                  "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                 );
  }
  if (formatAsCLiteral) {
    if ((0xf < Radix - 2) || (uVar5 = Radix - 2 >> 1, (0x99U >> (uVar5 & 0x1f) & 1) == 0)) {
      llvm_unreachable_internal
                ("Invalid radix!",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0x7f5);
    }
    pcVar14 = &DAT_001b1570 + *(int *)(&DAT_001b1570 + (ulong)uVar5 * 4);
  }
  else {
    pcVar14 = "";
  }
  bVar4 = operator==(this,0);
  if (bVar4) {
    cVar1 = *pcVar14;
    while (cVar1 != '\0') {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar14);
      pcVar13 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      cVar1 = *pcVar13;
    }
    local_78.VAL._1_7_ = (undefined7)((ulong)local_78 >> 8);
    local_78.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_78.VAL);
  }
  else {
    uVar5 = this->BitWidth;
    if (0x40 < (ulong)uVar5) {
      uVar8 = (ulong)((uint)((ulong)uVar5 + 0x3f >> 3) & 0xfffffff8);
      local_80 = this;
      local_70 = uVar5;
      local_78.pVal = (uint64_t *)operator_new__(uVar8);
      memcpy(local_78.pVal,(local_80->U).pVal,uVar8);
      if ((Signed) && (bVar4 = operator[](local_80,uVar5 - 1), bVar4)) {
        flipAllBits((APInt *)&local_78);
        operator++((APInt *)&local_78);
        local_88._0_1_ = '-';
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
      }
      cVar1 = *pcVar14;
      while (cVar1 != '\0') {
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar14);
        pcVar13 = pcVar14 + 1;
        pcVar14 = pcVar14 + 1;
        cVar1 = *pcVar13;
      }
      uVar5 = (Str->super_SmallVectorTemplateBase<char,_true>).
              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
      if ((Radix == 2) || (Radix == 8)) {
        uVar6 = (uint)(Radix == 8) * 2 + 1;
      }
      else {
        uVar6 = 4;
        if (Radix != 0x10) {
          do {
            uVar15 = local_70;
            if (local_70 < 0x41) {
              if ((anon_union_8_2_1313ab2f_for_U *)local_78.VAL ==
                  (anon_union_8_2_1313ab2f_for_U *)0x0) goto LAB_00181d0e;
            }
            else {
              uVar6 = countLeadingZerosSlowCase((APInt *)&local_78);
              if (uVar6 == uVar15) goto LAB_00181d0e;
            }
            udivrem((APInt *)&local_78,RHS,(APInt *)&local_78,&local_88);
            if (RHS <= CONCAT71(local_88._1_7_,(char)local_88)) {
              __assert_fail("Digit < Radix && \"divide failed\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                            ,0x846,
                            "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                           );
            }
            SmallVectorTemplateBase<char,_true>::push_back
                      (&Str->super_SmallVectorTemplateBase<char,_true>,
                       "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" +
                       CONCAT71(local_88._1_7_,(char)local_88));
          } while( true );
        }
      }
      do {
        uVar15 = local_70;
        if (local_70 < 0x41) {
          if ((anon_union_8_2_1313ab2f_for_U *)local_78.VAL == (anon_union_8_2_1313ab2f_for_U *)0x0)
          goto LAB_00181d0e;
        }
        else {
          uVar7 = countLeadingZerosSlowCase((APInt *)&local_78);
          if (uVar7 == uVar15) {
LAB_00181d0e:
            pvVar3 = (Str->super_SmallVectorTemplateBase<char,_true>).
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
            uVar6 = (Str->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
            puVar10 = (undefined1 *)((long)pvVar3 + ((ulong)uVar6 - 1));
            if ((undefined1 *)((long)pvVar3 + (ulong)uVar5) < puVar10 && uVar5 != uVar6) {
              puVar12 = (undefined1 *)((long)pvVar3 + (ulong)uVar5);
              do {
                puVar11 = puVar12 + 1;
                uVar2 = *puVar12;
                *puVar12 = *puVar10;
                *puVar10 = uVar2;
                puVar10 = puVar10 + -1;
                uVar15 = local_70;
                puVar12 = puVar11;
              } while (puVar11 < puVar10);
            }
            if (uVar15 < 0x41) {
              return;
            }
            if ((anon_union_8_2_1313ab2f_for_U *)local_78.VAL ==
                (anon_union_8_2_1313ab2f_for_U *)0x0) {
              return;
            }
            operator_delete__(local_78.pVal);
            return;
          }
        }
        aVar9.pVal = (uint64_t *)&local_78;
        if (0x40 < uVar15) {
          aVar9 = local_78;
        }
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,
                   "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + ((uint)*aVar9.pVal & Radix - 1));
        lshrInPlace((APInt *)&local_78,uVar6);
      } while( true );
    }
    if (Signed) {
      uVar8 = getSExtValue(this);
      if ((long)uVar8 < 0) {
        local_88._0_1_ = '-';
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
        uVar8 = -uVar8;
      }
    }
    else {
      uVar8 = getZExtValue(this);
    }
    cVar1 = *pcVar14;
    while (cVar1 != '\0') {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,pcVar14);
      pcVar13 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      cVar1 = *pcVar13;
    }
    pcVar14 = local_38 + 1;
    pcVar13 = pcVar14;
    if (uVar8 != 0) {
      do {
        pcVar13[-1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar8 % RHS];
        pcVar13 = pcVar13 + -1;
        bVar4 = RHS <= uVar8;
        uVar8 = uVar8 / RHS;
      } while (bVar4);
    }
    SmallVectorImpl<char>::append<char*,void>(Str,pcVar13,pcVar14);
  }
  return;
}

Assistant:

void APInt::toString(SmallVectorImpl<char> &Str, unsigned Radix,
                     bool Signed, bool formatAsCLiteral) const {
  assert((Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 ||
          Radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  const char *Prefix = "";
  if (formatAsCLiteral) {
    switch (Radix) {
      case 2:
        // Binary literals are a non-standard extension added in gcc 4.3:
        // http://gcc.gnu.org/onlinedocs/gcc-4.3.0/gcc/Binary-constants.html
        Prefix = "0b";
        break;
      case 8:
        Prefix = "0";
        break;
      case 10:
        break; // No prefix
      case 16:
        Prefix = "0x";
        break;
      default:
        llvm_unreachable("Invalid radix!");
    }
  }

  // First, check for a zero value and just short circuit the logic below.
  if (*this == 0) {
    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };
    Str.push_back('0');
    return;
  }

  static const char Digits[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";

  if (isSingleWord()) {
    char Buffer[65];
    char *BufPtr = std::end(Buffer);

    uint64_t N;
    if (!Signed) {
      N = getZExtValue();
    } else {
      int64_t I = getSExtValue();
      if (I >= 0) {
        N = I;
      } else {
        Str.push_back('-');
        N = -(uint64_t)I;
      }
    }

    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };

    while (N) {
      *--BufPtr = Digits[N % Radix];
      N /= Radix;
    }
    Str.append(BufPtr, std::end(Buffer));
    return;
  }

  APInt Tmp(*this);

  if (Signed && isNegative()) {
    // They want to print the signed version and it is a negative value
    // Flip the bits and add one to turn it into the equivalent positive
    // value and put a '-' in the result.
    Tmp.negate();
    Str.push_back('-');
  }

  while (*Prefix) {
    Str.push_back(*Prefix);
    ++Prefix;
  };

  // We insert the digits backward, then reverse them to get the right order.
  unsigned StartDig = Str.size();

  // For the 2, 8 and 16 bit cases, we can just shift instead of divide
  // because the number of bits per digit (1, 3 and 4 respectively) divides
  // equally.  We just shift until the value is zero.
  if (Radix == 2 || Radix == 8 || Radix == 16) {
    // Just shift tmp right for each digit width until it becomes zero
    unsigned ShiftAmt = (Radix == 16 ? 4 : (Radix == 8 ? 3 : 1));
    unsigned MaskAmt = Radix - 1;

    while (Tmp.getBoolValue()) {
      unsigned Digit = unsigned(Tmp.getRawData()[0]) & MaskAmt;
      Str.push_back(Digits[Digit]);
      Tmp.lshrInPlace(ShiftAmt);
    }
  } else {
    while (Tmp.getBoolValue()) {
      uint64_t Digit;
      udivrem(Tmp, Radix, Tmp, Digit);
      assert(Digit < Radix && "divide failed");
      Str.push_back(Digits[Digit]);
    }
  }

  // Reverse the digits before returning.
  std::reverse(Str.begin()+StartDig, Str.end());
}